

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getLockingMode(char *z)

{
  int iVar1;
  char *in_RDI;
  
  if (in_RDI != (char *)0x0) {
    iVar1 = sqlite3_stricmp(in_RDI,"exclusive");
    if (iVar1 == 0) {
      return 1;
    }
    iVar1 = sqlite3_stricmp(in_RDI,"normal");
    if (iVar1 == 0) {
      return 0;
    }
  }
  return -1;
}

Assistant:

static int getLockingMode(const char *z){
  if( z ){
    if( 0==sqlite3StrICmp(z, "exclusive") ) return PAGER_LOCKINGMODE_EXCLUSIVE;
    if( 0==sqlite3StrICmp(z, "normal") ) return PAGER_LOCKINGMODE_NORMAL;
  }
  return PAGER_LOCKINGMODE_QUERY;
}